

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,float power,
               ImGuiSliderFlags flags)

{
  ImDrawList *this;
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  ImGuiWindow *pIVar5;
  unsigned_long_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ImGuiCol idx;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float a_00;
  float fVar13;
  double dVar14;
  double dVar15;
  ImVec2 IVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_154;
  float local_13c;
  float local_138;
  float local_134;
  long local_130;
  float local_124;
  bool local_11d;
  ImGuiCol local_11c;
  ImRect local_118;
  ImRect local_108;
  undefined1 local_f8 [8];
  ImRect grab_bb;
  float grab_pos;
  float grab_t;
  unsigned_long_long v_new_off_round;
  unsigned_long_long v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  unsigned_long_long v_new;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  bool is_horizontal;
  ImU32 frame_col;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float power_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  unsigned_long_long *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  pIVar5 = GetCurrentWindow();
  if (pIVar2->ActiveId == id) {
    local_11c = 9;
  }
  else {
    local_11c = 7;
    if (pIVar2->HoveredId == id) {
      local_11c = 8;
    }
  }
  IVar4 = GetColorU32(local_11c,1.0);
  RenderNavHighlight(bb,id,1);
  RenderFrame(bb->Min,bb->Max,IVar4,true,(pIVar2->Style).FrameRounding);
  bVar9 = (flags & 1U) != 0;
  bVar10 = data_type == 4;
  bVar11 = data_type == 5;
  local_11d = bVar10 || bVar11;
  bVar1 = local_11d;
  if ((power == 1.0) && (!NAN(power))) {
    bVar1 = false;
  }
  if (bVar9) {
    local_124 = ImRect::GetHeight(bb);
  }
  else {
    local_124 = ImRect::GetWidth(bb);
  }
  local_124 = local_124 - 4.0;
  v_range._0_4_ = (pIVar2->Style).GrabMinSize;
  if (v_min < v_max) {
    local_130 = v_max - v_min;
  }
  else {
    local_130 = v_min - v_max;
  }
  if ((!bVar10 && !bVar11) && (-1 < local_130)) {
    v_range._0_4_ = ImMax<float>(local_124 / (float)(local_130 + 1),(pIVar2->Style).GrabMinSize);
  }
  fVar12 = ImMin<float>((float)v_range,local_124);
  if (bVar9) {
    local_134 = (bb->Min).y;
  }
  else {
    local_134 = (bb->Min).x;
  }
  a_00 = fVar12 * 0.5 + local_134 + 2.0;
  if (bVar9) {
    local_138 = (bb->Max).y;
  }
  else {
    local_138 = (bb->Max).x;
  }
  if ((!bVar1) || (local_13c = (float)(v_min * v_max), 0.0 <= local_13c)) {
    local_154 = (float)v_min;
    linear_dist_min_to_0._0_4_ = (float)(-(uint)(local_154 < 0.0) & 0x3f800000);
  }
  else {
    auVar17._8_4_ = (int)(v_min >> 0x20);
    auVar17._0_8_ = v_min;
    auVar17._12_4_ = 0x45300000;
    dVar14 = ImPow((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_min) - 4503599627370496.0),
                   1.0 / (double)power);
    auVar18._8_4_ = (int)(v_max >> 0x20);
    auVar18._0_8_ = v_max;
    auVar18._12_4_ = 0x45300000;
    dVar15 = ImPow((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_max) - 4503599627370496.0),
                   1.0 / (double)power);
    linear_dist_min_to_0._0_4_ = (float)(dVar14 / (dVar14 + dVar15));
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar2->ActiveId == id) {
    bVar3 = false;
    delta2.y = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        if (bVar9) {
          local_15c = (pIVar2->IO).MousePos.y;
        }
        else {
          local_15c = (pIVar2->IO).MousePos.x;
        }
        if (local_124 - fVar12 <= 0.0) {
          local_160 = 0.0;
        }
        else {
          local_160 = ImClamp<float>((local_15c - a_00) / (local_124 - fVar12),0.0,1.0);
        }
        delta2.y = local_160;
        if (bVar9) {
          delta2.y = 1.0 - local_160;
        }
        bVar3 = true;
      }
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar16 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (bVar9) {
        delta = IVar16.y;
        local_164 = -delta;
      }
      else {
        v_new._4_4_ = IVar16.x;
        local_164 = v_new._4_4_;
      }
      if ((pIVar2->NavActivatePressedId == id) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((local_164 != 0.0) || (NAN(local_164))) {
        delta2.y = SliderBehaviorCalcRatioFromValue<unsigned_long_long,double>
                             (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
        if ((local_11d) || (bVar1)) {
          v_new._0_4_ = local_164 / 100.0;
          bVar3 = IsNavInputDown(0xe);
          if (bVar3) {
            v_new._0_4_ = (float)v_new / 10.0;
          }
        }
        else if (((-100.0 <= (float)local_130) && ((float)local_130 <= 100.0)) ||
                (bVar3 = IsNavInputDown(0xe), bVar3)) {
          v_new._0_4_ = (float)(~-(uint)(local_164 < 0.0) & 0x3f800000 |
                               -(uint)(local_164 < 0.0) & 0xbf800000) / (float)local_130;
        }
        else {
          v_new._0_4_ = local_164 / 100.0;
        }
        bVar3 = IsNavInputDown(0xf);
        if (bVar3) {
          v_new._0_4_ = (float)v_new * 10.0;
        }
        bVar3 = true;
        if (((1.0 <= delta2.y) && (0.0 < (float)v_new)) ||
           ((delta2.y <= 0.0 && ((float)v_new < 0.0)))) {
          bVar3 = false;
        }
        else {
          delta2.y = ImSaturate(delta2.y + (float)v_new);
        }
      }
    }
    if (bVar3) {
      if (bVar1) {
        if (linear_dist_min_to_0._0_4_ <= delta2.y) {
          fVar13 = ImFabs(linear_dist_min_to_0._0_4_ - 1.0);
          if (fVar13 <= 1e-06) {
            v_new_off_f._0_4_ = delta2.y;
          }
          else {
            v_new_off_f._0_4_ =
                 (delta2.y - linear_dist_min_to_0._0_4_) / (1.0 - linear_dist_min_to_0._0_4_);
          }
          fVar13 = ImPow(v_new_off_f._0_4_,power);
          uVar6 = ImMax<unsigned_long_long>(v_min,0);
          _a_1 = ImLerp<unsigned_long_long>(uVar6,v_max,fVar13);
        }
        else {
          fVar13 = ImPow(1.0 - delta2.y / linear_dist_min_to_0._0_4_,power);
          uVar6 = ImMin<unsigned_long_long>(v_max,0);
          _a_1 = ImLerp<unsigned_long_long>(uVar6,v_min,fVar13);
        }
      }
      else if (bVar10 || bVar11) {
        _a_1 = ImLerp<unsigned_long_long>(v_min,v_max,delta2.y);
      }
      else {
        local_168 = (float)(v_max - v_min);
        local_168 = local_168 * delta2.y;
        uVar7 = (long)local_168 | (long)(local_168 - 9.223372e+18) & (long)local_168 >> 0x3f;
        uVar8 = (ulong)(local_168 + 0.5);
        uVar8 = uVar8 | (long)((local_168 + 0.5) - 9.223372e+18) & (long)uVar8 >> 0x3f;
        if ((!bVar10 && !bVar11) && (uVar7 < uVar8)) {
          uVar7 = uVar8;
        }
        _a_1 = v_min + uVar7;
      }
      uVar6 = RoundScalarWithFormat<unsigned_long_long,long_long>(format,data_type,_a_1);
      mouse_abs_pos._3_1_ = *v != uVar6;
      if (mouse_abs_pos._3_1_) {
        *v = uVar6;
      }
    }
  }
  grab_bb.Max.y =
       SliderBehaviorCalcRatioFromValue<unsigned_long_long,double>
                 (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
  if (bVar9) {
    grab_bb.Max.y = 1.0 - grab_bb.Max.y;
  }
  grab_bb.Max.x = ImLerp<float>(a_00,-fVar12 * 0.5 + (local_138 - 2.0),grab_bb.Max.y);
  ImRect::ImRect((ImRect *)local_f8);
  if (bVar9) {
    ImRect::ImRect(&local_118,(bb->Min).x + 2.0,-fVar12 * 0.5 + grab_bb.Max.x,(bb->Max).x - 2.0,
                   fVar12 * 0.5 + grab_bb.Max.x);
    local_f8._0_4_ = local_118.Min.x;
    local_f8._4_4_ = local_118.Min.y;
    grab_bb.Min = local_118.Max;
  }
  else {
    ImRect::ImRect(&local_108,-fVar12 * 0.5 + grab_bb.Max.x,(bb->Min).y + 2.0,
                   fVar12 * 0.5 + grab_bb.Max.x,(bb->Max).y - 2.0);
    local_f8._0_4_ = local_108.Min.x;
    local_f8._4_4_ = local_108.Min.y;
    grab_bb.Min = local_108.Max;
  }
  this = pIVar5->DrawList;
  idx = 0x13;
  if (pIVar2->ActiveId == id) {
    idx = 0x14;
  }
  IVar4 = GetColorU32(idx,1.0);
  ImDrawList::AddRectFilled
            (this,(ImVec2 *)local_f8,&grab_bb.Min,IVar4,(pIVar2->Style).GrabRounding,0xf);
  return mouse_abs_pos._3_1_;
}

Assistant:

static bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, frame_col, true, style.FrameRounding);

    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (bb.GetWidth() - grab_padding * 2.0f) : (bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? bb.Min.x : bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? bb.Max.x : bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (!is_horizontal)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = is_horizontal ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                if (is_decimal || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormat<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}